

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Dimension_ConstantDimension *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::MILSpec::Dimension_ConstantDimension>(Arena *arena)

{
  Arena *arena_local;
  
  if (arena == (Arena *)0x0) {
    arena_local = (Arena *)operator_new(0x20);
    CoreML::Specification::MILSpec::Dimension_ConstantDimension::Dimension_ConstantDimension
              ((Dimension_ConstantDimension *)arena_local,(Arena *)0x0,false);
  }
  else {
    arena_local = (Arena *)DoCreateMessage<CoreML::Specification::MILSpec::Dimension_ConstantDimension>
                                     (arena);
  }
  return (Dimension_ConstantDimension *)arena_local;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }